

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O2

int __thiscall GEO::geofile::simplify_element(geofile *this,int *current_status)

{
  ostream *poVar1;
  int iVar2;
  
  switch(*current_status) {
  case 0:
    iVar2 = 0;
    if ((this->points_map)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      simplify_points(this);
    }
    break;
  case 1:
    iVar2 = 0;
    if ((this->lines_map)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      simplify_lines(this);
    }
    break;
  case 2:
    iVar2 = 0;
    if ((this->curve_loops_map)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      simplify_curve_loops(this);
    }
    break;
  case 3:
    iVar2 = 0;
    if ((this->plane_surfaces_map)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      simplify_plane_surfaces(this);
    }
    break;
  case 4:
    iVar2 = 0;
    if ((this->surface_loops_map)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      simplify_surface_loops(this);
    }
    break;
  case 5:
    iVar2 = 0;
    if ((this->volumes_map)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      simplify_volumes(this);
      iVar2 = 0;
    }
    break;
  default:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Error: Unknown state in GEO::geofile::simplify_element.");
    std::endl<char,std::char_traits<char>>(poVar1);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int GEO::geofile::simplify_element(int &current_status)
{
    switch (current_status)
    {
    case 0:
        if(!points_map.empty())
            simplify_points();
        break;
    case 1:
        if(!lines_map.empty())
            simplify_lines();
        break;
    case 2:
        if(!curve_loops_map.empty())
            simplify_curve_loops();
        break;
    case 3:
        if(!plane_surfaces_map.empty())
            simplify_plane_surfaces();
        break;
    case 4:
        if(!surface_loops_map.empty())
            simplify_surface_loops();
        break;
    case 5:
        if(!volumes_map.empty())
            simplify_volumes();
        break;
    default:
        std::cout   << "Error: Unknown state in GEO::geofile::simplify_element."
                    << std::endl;
        return EXIT_FAILURE;
        break;
    }
    return EXIT_SUCCESS;
}